

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.hpp
# Opt level: O0

void __thiscall cs::structure::structure(structure *this,structure *s)

{
  shared_ptr<cs::domain_type> *in_RSI;
  shared_ptr<cs::domain_type> *in_RDI;
  
  *(undefined1 *)&(in_RDI->super___shared_ptr<cs::domain_type,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
       1;
  std::__cxx11::string::string
            ((string *)
             &(in_RDI->super___shared_ptr<cs::domain_type,_(__gnu_cxx::_Lock_policy)2>)._M_refcount,
             (string *)
             &(in_RSI->super___shared_ptr<cs::domain_type,_(__gnu_cxx::_Lock_policy)2>)._M_refcount)
  ;
  std::shared_ptr<cs::domain_type>::shared_ptr(in_RSI,in_RDI);
  in_RDI[3].super___shared_ptr<cs::domain_type,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       in_RSI[3].super___shared_ptr<cs::domain_type,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  in_RDI[4].super___shared_ptr<cs::domain_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       in_RSI[4].super___shared_ptr<cs::domain_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  return;
}

Assistant:

explicit structure(const structure *s) : m_shadow(true), m_id(s->m_id), m_name(s->m_name),
			m_data(s->m_data) {}